

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_vec2_float(void *a,float **uv,trico_stream_type st)

{
  ssize_t sVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong __size;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_floats_v;
  uint32_t nr_of_floats_u;
  uint32_t nr_vec2_positions;
  float *decompressed_v;
  float *decompressed_u;
  
  iVar3 = 0;
  if (*(trico_stream_type *)((long)a + 0x24) == st) {
    sVar1 = read((int)&nr_vec2_positions,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      iVar3 = 0;
    }
    else {
      sVar1 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      iVar3 = 0;
      if ((int)sVar1 != 0) {
        __size = (ulong)nr_of_compressed_bytes;
        puVar2 = (uint8_t *)malloc(__size);
        sVar1 = read((int)puVar2,(void *)0x1,__size);
        iVar3 = 0;
        if ((int)sVar1 != 0) {
          trico_decompress(&nr_of_floats_u,&decompressed_u,puVar2);
          sVar1 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
          iVar3 = 0;
          if ((int)sVar1 != 0) {
            puVar2 = (uint8_t *)realloc(puVar2,(ulong)nr_of_compressed_bytes);
            sVar1 = read((int)puVar2,(void *)0x1,(ulong)nr_of_compressed_bytes);
            if ((int)sVar1 != 0) {
              trico_decompress(&nr_of_floats_v,&decompressed_v,puVar2);
              free(puVar2);
              if (nr_of_floats_u != nr_vec2_positions) {
                __assert_fail("nr_of_floats_u == nr_vec2_positions",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x4fe,
                              "int trico_read_vec2_float(void *, float **, enum trico_stream_type)")
                ;
              }
              if (nr_of_floats_v != nr_of_floats_u) {
                __assert_fail("nr_of_floats_v == nr_of_floats_u",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x4ff,
                              "int trico_read_vec2_float(void *, float **, enum trico_stream_type)")
                ;
              }
              if (uv != (float **)0x0) {
                trico_transpose_uv_soa_to_aos(uv,decompressed_u,decompressed_v,nr_of_floats_u);
              }
              free(decompressed_u);
              free(decompressed_v);
              read_next_stream_type((trico_archive *)a);
              iVar3 = 1;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int trico_read_vec2_float(void* a, float** uv, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vec2_positions;
  if (!read(&nr_vec2_positions, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_u;
  uint32_t nr_of_floats_u;
  trico_decompress(&nr_of_floats_u, &decompressed_u, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_v;
  uint32_t nr_of_floats_v;
  trico_decompress(&nr_of_floats_v, &decompressed_v, (const uint8_t*)compressed);

  trico_free(compressed);

  assert(nr_of_floats_u == nr_vec2_positions);
  assert(nr_of_floats_v == nr_of_floats_u);

  if (uv != NULL)
    trico_transpose_uv_soa_to_aos(uv, decompressed_u, decompressed_v, nr_vec2_positions);

  trico_free(decompressed_u);
  trico_free(decompressed_v);

  read_next_stream_type(arch);

  return 1;
  }